

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_copy(lua_State *L,int fromidx,int toidx)

{
  GCObject *o;
  int iVar1;
  undefined4 uVar2;
  TValue *io1;
  TValue *pTVar3;
  TValue *pTVar4;
  
  pTVar3 = index2addr(L,fromidx);
  pTVar4 = index2addr(L,toidx);
  iVar1 = pTVar3->tt_;
  uVar2 = *(undefined4 *)&pTVar3->field_0xc;
  pTVar4->value_ = pTVar3->value_;
  pTVar4->tt_ = iVar1;
  *(undefined4 *)&pTVar4->field_0xc = uVar2;
  if ((((toidx < -0xf4628) && ((pTVar3->tt_ & 0x40) != 0)) &&
      (o = (L->ci->func->value_).gc, (o->marked & 4) != 0)) &&
     ((((pTVar3->value_).gc)->marked & 3) != 0)) {
    luaC_barrier_(L,o,(pTVar3->value_).gc);
    return;
  }
  return;
}

Assistant:

LUA_API void lua_copy(lua_State *L, int fromidx, int toidx) {
    TValue *fr, *to;
    lua_lock(L);
    fr = index2addr(L, fromidx);
    to = index2addr(L, toidx);
    api_checkvalidindex(L, to);
    setobj(L, to, fr);
    if (isupvalue(toidx))  /* function upvalue? */
        luaC_barrier(L, clCvalue(L->ci->func), fr);
    /* LUA_REGISTRYINDEX does not need gc barrier
       (collector revisits it before finishing collection) */
    lua_unlock(L);
}